

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

bool __thiscall dxil_spv::CFGNode::post_dominates_perfect_structured_construct(CFGNode *this)

{
  CFGNode *pCVar1;
  CFGNode *pCVar2;
  pointer ppCVar3;
  bool bVar4;
  
  pCVar1 = this->immediate_dominator;
  do {
    pCVar2 = pCVar1;
    if (pCVar2 == this) goto LAB_0014bd90;
    pCVar1 = pCVar2->immediate_post_dominator;
  } while ((pCVar1 != (CFGNode *)0x0) && (pCVar2 != pCVar1));
  if (pCVar2 == this) {
LAB_0014bd90:
    for (ppCVar3 = (this->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        bVar4 = ppCVar3 ==
                (this->pred).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish, !bVar4; ppCVar3 = ppCVar3 + 1) {
      pCVar1 = *ppCVar3;
      do {
        pCVar2 = pCVar1;
        if (pCVar2 == this) goto LAB_0014bdc7;
        pCVar1 = pCVar2->immediate_post_dominator;
      } while ((pCVar1 != (CFGNode *)0x0) && (pCVar2 != pCVar1));
      if (pCVar2 != this) {
        return bVar4;
      }
LAB_0014bdc7:
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CFGNode::post_dominates_perfect_structured_construct() const
{
	if (!post_dominates(immediate_dominator))
		return false;

	for (auto *p : pred)
		if (!post_dominates(p))
			return false;
	return true;
}